

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implicit_weak_message.h
# Opt level: O0

MessageLite * __thiscall
google::protobuf::internal::ImplicitWeakMessage::New(ImplicitWeakMessage *this,Arena *arena)

{
  type_info *in_RSI;
  ArenaImpl *in_RDI;
  size_t n;
  Arena **in_stack_ffffffffffffff68;
  ImplicitWeakMessage *in_stack_ffffffffffffff70;
  type_info *allocated_type;
  Arena *in_stack_ffffffffffffff80;
  type_info *n_00;
  undefined8 local_38;
  
  if (in_RSI == (type_info *)0x0) {
    local_38 = (ImplicitWeakMessage *)operator_new(0x30);
    ImplicitWeakMessage(in_stack_ffffffffffffff70);
  }
  else {
    allocated_type = in_RSI;
    n_00 = in_RSI;
    AlignUpTo8(0x30);
    Arena::AllocHook(in_stack_ffffffffffffff80,allocated_type,(size_t)in_RSI);
    ArenaImpl::AllocateAlignedAndAddCleanup
              (in_RDI,(size_t)n_00,(_func_void_void_ptr *)in_stack_ffffffffffffff80);
    local_38 = Arena::InternalHelper<google::protobuf::internal::ImplicitWeakMessage>::
               Construct<google::protobuf::Arena*>(in_RSI,in_stack_ffffffffffffff68);
  }
  return &local_38->super_MessageLite;
}

Assistant:

MessageLite* New(Arena* arena) const override {
    return Arena::CreateMessage<ImplicitWeakMessage>(arena);
  }